

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *final_users)

{
  value_type def;
  bool bVar1;
  reference ppIVar2;
  DefUseManager *this_00;
  anon_class_24_3_856ebe40 local_b0;
  function<void_(spvtools::opt::Instruction_*)> local_98;
  value_type local_78;
  Instruction *inst_from_work_list;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  work_list;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *final_users_local;
  Instruction *access_chain_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  work_list.c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)final_users;
  final_users_local =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       access_chain;
  access_chain_local = (Instruction *)this;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            ((queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
              *)&inst_from_work_list);
  std::
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::push((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          *)&inst_from_work_list,(value_type *)&final_users_local);
  while( true ) {
    bVar1 = std::
            queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            ::empty((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                     *)&inst_from_work_list);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppIVar2 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::front((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                       *)&inst_from_work_list);
    local_78 = *ppIVar2;
    std::
    queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::pop((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
           *)&inst_from_work_list);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    def = local_78;
    local_b0.final_users =
         (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
         work_list.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_b0.work_list =
         (queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
          *)&inst_from_work_list;
    local_b0.this = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType(spvtools::opt::Instruction*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>*)const::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_98,&local_b0);
    analysis::DefUseManager::ForEachUser(this_00,def,&local_98);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_98);
  }
  std::
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::~queue((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            *)&inst_from_work_list);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType(
    Instruction* access_chain, std::vector<Instruction*>* final_users) const {
  std::queue<Instruction*> work_list;
  work_list.push(access_chain);
  while (!work_list.empty()) {
    auto* inst_from_work_list = work_list.front();
    work_list.pop();
    get_def_use_mgr()->ForEachUser(
        inst_from_work_list, [this, final_users, &work_list](Instruction* use) {
          // TODO: Support Boolean type as well.
          if (!use->HasResultId() || IsConcreteType(use->type_id())) {
            final_users->push_back(use);
          } else {
            work_list.push(use);
          }
        });
  }
}